

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall
polyscope::SlicePlane::setSceneObjectUniforms(SlicePlane *this,ShaderProgram *p,bool alwaysPass)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  byte bVar2;
  byte bVar3;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  float _x;
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar9;
  undefined1 extraout_var_00 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  vec3 vVar13;
  col_type cVar14;
  mat4 viewMat;
  vec3 center;
  vec3 normal;
  SlicePlane *in_stack_fffffffffffffdf0;
  string *psVar15;
  string *__lhs;
  undefined7 in_stack_fffffffffffffe30;
  string local_1a8 [32];
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_178;
  undefined4 local_170;
  string local_168 [32];
  row_type *in_stack_fffffffffffffeb8;
  row_type *v;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  row_type *local_138;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_130;
  vec<4,float,(glm::qualifier)0> local_12c [16];
  vec<4,_float,_(glm::qualifier)0> local_11c;
  undefined8 local_10c;
  undefined4 local_104;
  vec<3,_float,_(glm::qualifier)0> local_100;
  vec<3,_float,_(glm::qualifier)0> local_f0;
  vec<4,float,(glm::qualifier)0> local_e0 [16];
  vec<4,_float,_(glm::qualifier)0> local_d0;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_74;
  undefined4 local_6c;
  undefined8 local_68;
  undefined4 local_60;
  undefined8 local_5c;
  undefined4 local_54;
  undefined8 local_50;
  undefined4 local_48;
  string local_38 [39];
  byte local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  undefined1 auVar8 [56];
  undefined1 auVar12 [56];
  
  local_11 = in_DL & 1;
  __lhs = local_38;
  local_10 = in_RSI;
  std::operator+((char *)__lhs,in_RSI);
  bVar2 = (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,__lhs);
  bVar3 = bVar2 ^ 0xff;
  std::__cxx11::string::~string(local_38);
  if ((bVar3 & 1) == 0) {
    if ((local_11 & 1) == 0) {
      auVar8 = extraout_var;
      auVar12 = extraout_var_00;
      view::getCameraViewMatrix();
      vVar13 = getNormal((SlicePlane *)CONCAT17(bVar2,in_stack_fffffffffffffe30));
      local_100.field_2 = vVar13.field_2;
      auVar4._0_8_ = vVar13._0_8_;
      auVar4._8_56_ = auVar8;
      local_100._0_8_ = vmovlpd_avx(auVar4._0_16_);
      auVar8 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
      local_f0._0_8_ = local_100._0_8_;
      local_f0.field_2 = local_100.field_2;
      glm::vec<4,float,(glm::qualifier)0>::vec<float,double,(glm::qualifier)0>
                (local_e0,&local_f0,0.0);
      cVar14 = glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                              in_stack_fffffffffffffeb8);
      auVar10._0_8_ = cVar14._8_8_;
      auVar10._8_56_ = auVar12;
      auVar5._0_8_ = cVar14._0_8_;
      auVar5._8_56_ = auVar8;
      local_d0._0_8_ = vmovlpd_avx(auVar5._0_16_);
      local_d0._8_8_ = vmovlpd_avx(auVar10._0_16_);
      glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
                ((vec<3,float,(glm::qualifier)0> *)&local_c0,&local_d0);
      local_48 = local_b8;
      local_50 = local_c0;
      vVar13 = getCenter(in_stack_fffffffffffffdf0);
      aVar9 = vVar13.field_2;
      auVar6._0_8_ = vVar13._0_8_;
      auVar6._8_56_ = auVar8;
      v = (row_type *)vmovlpd_avx(auVar6._0_16_);
      auVar8 = ZEXT856(0);
      local_138 = v;
      local_130 = aVar9;
      glm::vec<4,float,(glm::qualifier)0>::vec<float,double,(glm::qualifier)0>
                (local_12c,(vec<3,_float,_(glm::qualifier)0> *)&local_138,1.0);
      cVar14 = glm::operator*((mat<4,_4,_float,_(glm::qualifier)0> *)
                              CONCAT44(in_stack_fffffffffffffec4,aVar9),v);
      auVar11._0_8_ = cVar14._8_8_;
      auVar11._8_56_ = auVar12;
      auVar7._0_8_ = cVar14._0_8_;
      auVar7._8_56_ = auVar8;
      local_11c._0_8_ = vmovlpd_avx(auVar7._0_16_);
      local_11c._8_8_ = vmovlpd_avx(auVar11._0_16_);
      glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
                ((vec<3,float,(glm::qualifier)0> *)&local_10c,&local_11c);
      local_5c = local_10c;
      local_54 = local_104;
    }
    else {
      glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
                ((vec<3,float,(glm::qualifier)0> *)&local_68,-1.0,0.0,0.0);
      local_50 = local_68;
      local_48 = local_60;
      _x = std::numeric_limits<float>::infinity();
      glm::vec<3,float,(glm::qualifier)0>::vec<float,double,double>
                ((vec<3,float,(glm::qualifier)0> *)&local_74,_x,0.0,0.0);
      local_5c = local_74;
      local_54 = local_6c;
    }
    pbVar1 = local_10;
    psVar15 = local_168;
    std::operator+((char *)__lhs,in_RSI);
    local_170 = local_48;
    local_178 = local_50;
    local_180 = local_48;
    local_188 = local_50;
    (**(code **)(*(long *)pbVar1 + 0x48))(local_50,local_48,pbVar1,psVar15);
    std::__cxx11::string::~string(local_168);
    std::operator+((char *)__lhs,in_RSI);
    (**(code **)(*(long *)local_10 + 0x48))(local_5c,local_54,local_10,local_1a8);
    std::__cxx11::string::~string(local_1a8);
  }
  return;
}

Assistant:

void SlicePlane::setSceneObjectUniforms(render::ShaderProgram& p, bool alwaysPass) {
  if (!p.hasUniform("u_slicePlaneNormal_" + postfix)) {
    return;
  }

  glm::vec3 normal, center;

  if (alwaysPass) {
    normal = glm::vec3{-1., 0., 0.};
    center = glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  } else {
    glm::mat4 viewMat = view::getCameraViewMatrix();
    normal = glm::vec3(viewMat * glm::vec4(getNormal(), 0.));
    center = glm::vec3(viewMat * glm::vec4(getCenter(), 1.));
  }

  p.setUniform("u_slicePlaneNormal_" + postfix, normal);
  p.setUniform("u_slicePlaneCenter_" + postfix, center);
}